

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O0

int __thiscall
FResourceFile::FilterLumpsByGameType
          (FResourceFile *this,int type,void *lumps,size_t lumpsize,DWORD max)

{
  int iVar1;
  int iVar2;
  FString local_68;
  FString local_60;
  FString filter;
  FString local_48;
  int local_3c;
  int local_38;
  int i;
  int count;
  DWORD max_local;
  size_t lumpsize_local;
  void *lumps_local;
  FResourceFile *pFStack_18;
  int type_local;
  FResourceFile *this_local;
  
  if (type == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_38 = 0;
    local_3c = 0;
    i = max;
    _count = lumpsize;
    lumpsize_local = (size_t)lumps;
    lumps_local._4_4_ = type;
    pFStack_18 = this;
    while (FilterLumpsByGameType::blanket[local_3c].name != (char *)0x0) {
      if ((lumps_local._4_4_ & FilterLumpsByGameType::blanket[local_3c].match) != 0) {
        FString::FString(&local_48,FilterLumpsByGameType::blanket[local_3c].name);
        iVar1 = FilterLumps(this,&local_48,(void *)lumpsize_local,_count,i);
        local_38 = iVar1 + local_38;
        FString::~FString(&local_48);
      }
      local_3c = local_3c + 1;
    }
    FString::FString(&local_60,"game-");
    FString::operator+=(&local_60,GameNames[(int)lumps_local._4_4_]);
    iVar1 = local_38;
    FString::FString(&local_68,&local_60);
    iVar2 = FilterLumps(this,&local_68,(void *)lumpsize_local,_count,i);
    this_local._4_4_ = iVar1 + iVar2;
    FString::~FString(&local_68);
    FString::~FString(&local_60);
  }
  return this_local._4_4_;
}

Assistant:

int FResourceFile::FilterLumpsByGameType(int type, void *lumps, size_t lumpsize, DWORD max)
{
	static const struct { int match; const char *name; } blanket[] =
	{
		{ GAME_Raven,			"game-Raven" },
		{ GAME_DoomStrifeChex,	"game-DoomStrifeChex" },
		{ GAME_DoomChex,		"game-DoomChex" },
		{ GAME_Any, NULL }
	};
	if (type == 0)
	{
		return 0;
	}
	int count = 0;
	for (int i = 0; blanket[i].name != NULL; ++i)
	{
		if (type & blanket[i].match)
		{
			count += FilterLumps(blanket[i].name, lumps, lumpsize, max);
		}
	}
	FString filter = "game-";
	filter += GameNames[type];
	return count + FilterLumps(filter, lumps, lumpsize, max);
}